

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O1

void QGuiApplicationPrivate::processScreenLogicalDotsPerInchChange(ScreenLogicalDotsPerInchEvent *e)

{
  Data *pDVar1;
  QScreenPrivate *this;
  QWindow *this_00;
  double dVar2;
  char cVar3;
  iterator iVar4;
  iterator iVar5;
  QObject *pQVar6;
  long lVar7;
  QObject *pQVar8;
  undefined8 *puVar9;
  UpdateEmitter *pUVar10;
  long in_FS_OFFSET;
  byte bVar11;
  UpdateEmitter updateEmitter;
  undefined1 local_70 [16];
  qsizetype qStack_60;
  long local_28;
  
  bVar11 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = QCoreApplication::startingUp();
  if (cVar3 == '\0') {
    QHighDpiScaling::updateHighDpiScaling();
    pDVar1 = (e->screen).wp.d;
    if (((pDVar1 != (Data *)0x0) &&
        ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i != 0)) &&
       ((e->screen).wp.value != (QObject *)0x0)) {
      if ((pDVar1 == (Data *)0x0) ||
         ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
        pQVar6 = (QObject *)0x0;
      }
      else {
        pQVar6 = (e->screen).wp.value;
      }
      puVar9 = &DAT_00690650;
      pUVar10 = (UpdateEmitter *)local_70;
      for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pUVar10->initialState).platformScreen = (QPlatformScreen *)*puVar9;
        puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
        pUVar10 = (UpdateEmitter *)((long)pUVar10 + (ulong)bVar11 * -0x10 + 8);
      }
      QScreenPrivate::UpdateEmitter::UpdateEmitter((UpdateEmitter *)local_70,(QScreen *)pQVar6);
      this = *(QScreenPrivate **)(pQVar6 + 8);
      dVar2 = e->dpiY;
      (this->super_QScreenData).logicalDpi.first = e->dpiX;
      (this->super_QScreenData).logicalDpi.second = dVar2;
      QScreenPrivate::updateGeometry(this);
      QScreenPrivate::UpdateEmitter::~UpdateEmitter((UpdateEmitter *)local_70);
      local_70._0_8_ = window_list.d.d;
      local_70._8_8_ = window_list.d.ptr;
      qStack_60 = window_list.d.size;
      if (window_list.d.d != (Data *)0x0) {
        LOCK();
        ((window_list.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((window_list.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      iVar4 = QList<QWindow_*>::begin((QList<QWindow_*> *)local_70);
      iVar5 = QList<QWindow_*>::end((QList<QWindow_*> *)local_70);
      for (; iVar4.i != iVar5.i; iVar4.i = iVar4.i + 1) {
        this_00 = *iVar4.i;
        pQVar6 = &QWindow::screen(this_00)->super_QObject;
        pDVar1 = (e->screen).wp.d;
        if ((pDVar1 == (Data *)0x0) ||
           ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
          pQVar8 = (QObject *)0x0;
        }
        else {
          pQVar8 = (e->screen).wp.value;
        }
        if (pQVar8 == pQVar6) {
          QWindowPrivate::updateDevicePixelRatio(*(QWindowPrivate **)&this_00->field_0x8);
        }
      }
      if ((QArrayData *)local_70._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_70._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_70._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QArrayData *)local_70._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_70._0_8_,8,0x10);
        }
      }
      m_maxDevicePixelRatio = 0.0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGuiApplicationPrivate::processScreenLogicalDotsPerInchChange(QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInchEvent *e)
{
    // This operation only makes sense after the QGuiApplication constructor runs
    if (QCoreApplication::startingUp())
        return;

    QHighDpiScaling::updateHighDpiScaling();

    if (!e->screen)
        return;

    {
        QScreen *s = e->screen.data();
        QScreenPrivate::UpdateEmitter updateEmitter(s);
        s->d_func()->logicalDpi = QDpi(e->dpiX, e->dpiY);
        s->d_func()->updateGeometry();
    }

    for (QWindow *window : QGuiApplication::allWindows())
        if (window->screen() == e->screen)
            QWindowPrivate::get(window)->updateDevicePixelRatio();

    resetCachedDevicePixelRatio();
}